

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

int __thiscall
kj::anon_unknown_0::AsyncStreamFd::getsockopt
          (AsyncStreamFd *this,int __fd,int __level,int __optname,void *__optval,socklen_t *__optlen
          )

{
  int iVar1;
  undefined4 in_register_0000000c;
  socklen_t socklen;
  Fault f;
  socklen_t local_5c;
  socklen_t *local_58;
  Fault local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_5c = *__optval;
  local_58 = (socklen_t *)__optval;
  do {
    iVar1 = ::getsockopt((this->super_OwnedFileDescriptor).fd,__fd,__level,
                         (void *)CONCAT44(in_register_0000000c,__optname),&local_5c);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    *local_58 = local_5c;
    return local_5c;
  }
  local_50.exception = (Exception *)0x0;
  local_48 = 0;
  uStack_40 = 0;
  kj::_::Debug::Fault::init
            (&local_50,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
            );
  kj::_::Debug::Fault::fatal(&local_50);
}

Assistant:

void getsockopt(int level, int option, void* value, uint* length) override {
    socklen_t socklen = *length;
    KJ_SYSCALL(::getsockopt(fd, level, option, value, &socklen));
    *length = socklen;
  }